

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtObj.c
# Opt level: O0

uint32_t NewtDeeplyLength(newtRefArg r)

{
  uint16_t uVar1;
  undefined4 local_14;
  uint32_t len;
  newtRefArg r_local;
  
  uVar1 = NewtGetRefType(r,true);
  if (uVar1 == 0xb) {
    local_14 = NewtDeeplyFrameLength(r);
  }
  else {
    local_14 = NewtLength(r);
  }
  return local_14;
}

Assistant:

uint32_t NewtDeeplyLength(newtRefArg r)
{
    uint32_t	len = 0;
    
    switch (NewtGetRefType(r, true))
    {
        case kNewtFrame:
            len = NewtDeeplyFrameLength(r);
            break;
            
        default:
            len = NewtLength(r);
            break;
    }
    
    return len;
}